

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall cmQtAutoMocUic::SettingsFileWrite(cmQtAutoMocUic *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  ulong *puVar4;
  string *filename;
  anon_class_8_1_bc116759 SettingAppend;
  char cVar5;
  string content;
  string error;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((this->MocConst_).SettingsChanged != false) || ((this->UicConst_).SettingsChanged == true)) {
    if ((this->Logger_).Verbosity_ != 0) {
      cmQtAutoGen::Quoted(&local_68,&this->SettingsFile_);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x518864);
      puVar4 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4) {
        local_88.field_2._M_allocated_capacity = *puVar4;
        local_88.field_2._8_8_ = plVar3[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *puVar4;
        local_88._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_88._M_string_length = plVar3[1];
      *plVar3 = (long)puVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      cmQtAutoGenerator::Logger::Info(&this->Logger_,GEN,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
    }
    paVar1 = &local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cVar5 = (char)&local_88;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    if ((this->SettingsStringMoc_)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_88);
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::_M_append
                ((char *)&local_88,(ulong)(this->SettingsStringMoc_)._M_dataplus._M_p);
      std::__cxx11::string::push_back(cVar5);
    }
    if ((this->SettingsStringUic_)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_88);
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::_M_append
                ((char *)&local_88,(ulong)(this->SettingsStringUic_)._M_dataplus._M_p);
      std::__cxx11::string::push_back(cVar5);
    }
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    filename = &this->SettingsFile_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    bVar2 = cmQtAutoGenerator::FileWrite(filename,&local_88,&local_68);
    if (!bVar2) {
      std::operator+(&local_48,"Settings file writing failed. ",&local_68);
      cmQtAutoGenerator::Logger::ErrorFile(&this->Logger_,GEN,filename,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::RemoveFile(filename);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmQtAutoMocUic::SettingsFileWrite()
{
  // Only write if any setting changed
  if (MocConst().SettingsChanged || UicConst().SettingsChanged) {
    if (Log().Verbose()) {
      Log().Info(GenT::GEN, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Compose settings file content
    std::string content;
    {
      auto SettingAppend = [&content](const char* key,
                                      std::string const& value) {
        if (!value.empty()) {
          content += key;
          content += ':';
          content += value;
          content += '\n';
        }
      };
      SettingAppend("moc", SettingsStringMoc_);
      SettingAppend("uic", SettingsStringUic_);
    }
    // Write settings file
    std::string error;
    if (!cmQtAutoGenerator::FileWrite(SettingsFile_, content, &error)) {
      Log().ErrorFile(GenT::GEN, SettingsFile_,
                      "Settings file writing failed. " + error);
      // Remove old settings file to trigger a full rebuild on the next run
      cmSystemTools::RemoveFile(SettingsFile_);
      return false;
    }
  }
  return true;
}